

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_nl.c
# Opt level: O1

void FeedObjGradient(void *p_user_data,int i,void *p_api_data)

{
  CAPIExample *pex;
  long lVar1;
  long lVar2;
  
  if (0 < *(int *)((long)p_user_data + 0x68)) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      NLW2_WriteSparseDblEntry
                (p_api_data,*(int *)(*(long *)((long)p_user_data + 0x60) + -8 + lVar2),
                 *(double *)(*(long *)((long)p_user_data + 0x60) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < *(int *)((long)p_user_data + 0x68));
  }
  return;
}

Assistant:

void FeedObjGradient(
    void* p_user_data, int i, void* p_api_data) {
  CAPIExample* pex = (CAPIExample*)p_user_data;
  assert(0==i);
  for (int j=0; j<pex->n_obj_nz; ++j)
    NLW2_WriteSparseDblEntry(p_api_data,
                             pex->obj_linpart[j].index_,
                             pex->obj_linpart[j].value_);
}